

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::CloseCurrentPopup(void)

{
  uint uVar1;
  uint uVar2;
  ImGuiPopupRef *pIVar3;
  ImGuiWindow *pIVar4;
  uint uVar5;
  uint uVar6;
  uint remaining;
  
  uVar5 = (GImGui->CurrentPopupStack).Size;
  if ((0 < (int)uVar5) && (uVar2 = (GImGui->OpenPopupStack).Size, (int)uVar5 <= (int)uVar2)) {
    uVar6 = uVar5 - 1;
    pIVar3 = (GImGui->OpenPopupStack).Data;
    if ((GImGui->CurrentPopupStack).Data[uVar6].PopupId == pIVar3[uVar6].PopupId) {
      remaining = 0;
      if (uVar5 != 1) {
        do {
          uVar1 = uVar5 - 1;
          if (uVar2 <= uVar1) {
            __assert_fail("i < Size",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                          ,0x4c0,
                          "value_type &ImVector<ImGuiPopupRef>::operator[](int) [T = ImGuiPopupRef]"
                         );
          }
          pIVar4 = pIVar3[uVar1].Window;
          remaining = uVar6;
          if (pIVar4 == (ImGuiWindow *)0x0) break;
          if ((pIVar4->Flags & 0x10000000) == 0) {
            remaining = uVar5 - 1;
            break;
          }
          uVar6 = uVar6 - 1;
          uVar5 = uVar1;
          remaining = 0;
        } while (1 < (int)uVar1);
      }
      ClosePopupToLevel(remaining);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::CloseCurrentPopup()
{
    ImGuiContext& g = *GImGui;
    int popup_idx = g.CurrentPopupStack.Size - 1;
    if (popup_idx < 0 || popup_idx >= g.OpenPopupStack.Size || g.CurrentPopupStack[popup_idx].PopupId != g.OpenPopupStack[popup_idx].PopupId)
        return;
    while (popup_idx > 0 && g.OpenPopupStack[popup_idx].Window && (g.OpenPopupStack[popup_idx].Window->Flags & ImGuiWindowFlags_ChildMenu))
        popup_idx--;
    ClosePopupToLevel(popup_idx);
}